

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smallft.c
# Opt level: O2

void dradfg(int ido,int ip,int l1,int idl1,float *cc,float *c1,float *c2,float *ch,float *ch2,
           float *wa)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  float *pfVar11;
  float *pfVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  float *pfVar17;
  int iVar18;
  float *pfVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  bool bVar29;
  double dVar30;
  double dVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  
  dVar30 = cos((double)(6.2831855 / (float)ip));
  dVar31 = sin((double)(6.2831855 / (float)ip));
  iVar1 = ip + 1 >> 1;
  iVar2 = ido + -1 >> 1;
  iVar3 = l1 * ido;
  uVar22 = 0;
  if (0 < idl1) {
    uVar22 = (ulong)(uint)idl1;
  }
  lVar14 = (long)ido;
  if (ido != 1) {
    iVar4 = 1;
    for (uVar6 = 0; uVar22 != uVar6; uVar6 = uVar6 + 1) {
      ch2[uVar6] = c2[uVar6];
    }
    iVar20 = 0;
    if (0 < l1) {
      iVar20 = l1;
    }
    lVar28 = lVar14 * 4;
    iVar5 = iVar3;
    for (; iVar4 < ip; iVar4 = iVar4 + 1) {
      lVar16 = (long)iVar5 << 2;
      iVar7 = iVar20;
      while (bVar29 = iVar7 != 0, iVar7 = iVar7 + -1, bVar29) {
        *(undefined4 *)((long)ch + lVar16) = *(undefined4 *)((long)c1 + lVar16);
        lVar16 = lVar16 + lVar28;
      }
      iVar5 = iVar5 + iVar3;
    }
    if (l1 < iVar2) {
      iVar5 = -1;
      iVar7 = iVar3;
      for (iVar4 = 1; iVar4 < ip; iVar4 = iVar4 + 1) {
        iVar21 = iVar7;
        for (iVar25 = 0; iVar25 != iVar20; iVar25 = iVar25 + 1) {
          for (lVar16 = 2; (int)lVar16 < ido; lVar16 = lVar16 + 2) {
            ch[(long)iVar21 + lVar16 + -1] =
                 wa[(long)iVar5 + lVar16 + -1] * c1[(long)iVar21 + lVar16 + -1] +
                 wa[iVar5 + lVar16] * c1[iVar21 + lVar16];
            ch[iVar21 + lVar16] =
                 wa[(long)iVar5 + lVar16 + -1] * c1[iVar21 + lVar16] -
                 c1[(long)iVar21 + lVar16 + -1] * wa[iVar5 + lVar16];
          }
          iVar21 = iVar21 + ido;
        }
        iVar7 = iVar7 + iVar3;
        iVar5 = iVar5 + ido;
      }
    }
    else {
      iVar4 = -1;
      iVar7 = iVar3 + 2;
      for (iVar5 = 1; iVar5 < ip; iVar5 = iVar5 + 1) {
        lVar16 = (long)iVar4;
        iVar25 = iVar7;
        for (iVar21 = 2; iVar21 < ido; iVar21 = iVar21 + 2) {
          lVar26 = (long)iVar25 << 2;
          lVar23 = lVar16 + 2;
          iVar8 = iVar20;
          while (bVar29 = iVar8 != 0, iVar8 = iVar8 + -1, bVar29) {
            *(float *)((long)ch + lVar26 + -4) =
                 wa[lVar16 + 1] * *(float *)((long)c1 + lVar26 + -4) +
                 wa[lVar23] * *(float *)((long)c1 + lVar26);
            *(float *)((long)ch + lVar26) =
                 wa[lVar16 + 1] * *(float *)((long)c1 + lVar26) -
                 *(float *)((long)c1 + lVar26 + -4) * wa[lVar23];
            lVar26 = lVar26 + lVar28;
          }
          iVar25 = iVar25 + 2;
          lVar16 = lVar23;
        }
        iVar7 = iVar7 + iVar3;
        iVar4 = iVar4 + ido;
      }
    }
    if (iVar2 < l1) {
      iVar5 = (l1 + -1) * ido + 2;
      iVar7 = ((ip + -1) * l1 + -1) * ido + 2;
      for (iVar4 = 1; iVar4 < iVar1; iVar4 = iVar4 + 1) {
        iVar8 = iVar7;
        iVar25 = iVar5;
        for (iVar21 = 2; iVar21 < ido; iVar21 = iVar21 + 2) {
          lVar16 = iVar8 + lVar14;
          lVar23 = iVar25 + lVar14;
          lVar26 = 0;
          iVar18 = iVar20;
          while (bVar29 = iVar18 != 0, iVar18 = iVar18 + -1, bVar29) {
            *(float *)((long)c1 + lVar26 + lVar23 * 4 + -4) =
                 *(float *)((long)ch + lVar26 + lVar23 * 4 + -4) +
                 *(float *)((long)ch + lVar26 + lVar16 * 4 + -4);
            *(float *)((long)c1 + lVar26 + lVar16 * 4 + -4) =
                 *(float *)((long)ch + lVar26 + lVar23 * 4) -
                 *(float *)((long)ch + lVar26 + lVar16 * 4);
            *(float *)((long)c1 + lVar26 + lVar23 * 4) =
                 *(float *)((long)ch + lVar26 + lVar23 * 4) +
                 *(float *)((long)ch + lVar26 + lVar16 * 4);
            *(float *)((long)c1 + lVar26 + lVar16 * 4) =
                 *(float *)((long)ch + lVar26 + lVar16 * 4 + -4) -
                 *(float *)((long)ch + lVar26 + lVar23 * 4 + -4);
            lVar26 = lVar26 + lVar28;
          }
          iVar25 = iVar25 + 2;
          iVar8 = iVar8 + 2;
        }
        iVar5 = iVar5 + iVar3;
        iVar7 = iVar7 - iVar3;
      }
    }
    else {
      iVar7 = (ip + -1) * iVar3;
      iVar5 = iVar3;
      for (iVar4 = 1; iVar4 < iVar1; iVar4 = iVar4 + 1) {
        pfVar17 = ch + (long)iVar7 + 2;
        pfVar12 = c1 + (long)iVar7 + 2;
        pfVar11 = ch + (long)iVar5 + 2;
        pfVar19 = c1 + (long)iVar5 + 2;
        for (iVar21 = 0; iVar21 != iVar20; iVar21 = iVar21 + 1) {
          for (lVar28 = 0; (int)lVar28 + 2 < ido; lVar28 = lVar28 + 2) {
            pfVar19[lVar28 + -1] = pfVar11[lVar28 + -1] + pfVar17[lVar28 + -1];
            pfVar12[lVar28 + -1] = pfVar11[lVar28] - pfVar17[lVar28];
            pfVar19[lVar28] = pfVar11[lVar28] + pfVar17[lVar28];
            pfVar12[lVar28] = pfVar17[lVar28 + -1] - pfVar11[lVar28 + -1];
          }
          pfVar17 = pfVar17 + lVar14;
          pfVar12 = pfVar12 + lVar14;
          pfVar11 = pfVar11 + lVar14;
          pfVar19 = pfVar19 + lVar14;
        }
        iVar5 = iVar5 + iVar3;
        iVar7 = iVar7 - iVar3;
      }
    }
  }
  iVar4 = ip * ido;
  for (uVar6 = 0; uVar22 != uVar6; uVar6 = uVar6 + 1) {
    c2[uVar6] = ch2[uVar6];
  }
  iVar7 = ~l1 * ido + idl1 * ip;
  iVar5 = (l1 + -1) * ido;
  iVar20 = 0;
  if (0 < l1) {
    iVar20 = l1;
  }
  for (iVar21 = 1; iVar21 < iVar1; iVar21 = iVar21 + 1) {
    lVar23 = (long)iVar5;
    lVar16 = (long)iVar7;
    lVar28 = lVar14 * 4;
    iVar25 = iVar20;
    while (bVar29 = iVar25 != 0, iVar25 = iVar25 + -1, bVar29) {
      *(float *)((long)c1 + lVar28 + lVar23 * 4) =
           *(float *)((long)ch + lVar28 + lVar23 * 4) + *(float *)((long)ch + lVar28 + lVar16 * 4);
      *(float *)((long)c1 + lVar28 + lVar16 * 4) =
           *(float *)((long)ch + lVar28 + lVar16 * 4) - *(float *)((long)ch + lVar28 + lVar23 * 4);
      lVar28 = lVar28 + lVar14 * 4;
    }
    iVar7 = iVar7 - iVar3;
    iVar5 = iVar5 + iVar3;
  }
  iVar21 = (ip + -1) * idl1;
  lVar28 = (long)iVar21;
  fVar32 = 0.0;
  fVar34 = 1.0;
  iVar7 = idl1;
  for (iVar5 = 1; iVar5 < iVar1; iVar5 = iVar5 + 1) {
    fVar33 = (float)dVar30 * fVar34 - (float)dVar31 * fVar32;
    fVar32 = fVar32 * (float)dVar30 + fVar34 * (float)dVar31;
    for (uVar6 = 0; uVar22 != uVar6; uVar6 = uVar6 + 1) {
      ch2[(long)iVar7 + uVar6] = c2[(long)idl1 + uVar6] * fVar33 + c2[uVar6];
      ch2[(long)iVar21 + uVar6] = c2[lVar28 + uVar6] * fVar32;
    }
    fVar34 = fVar32;
    fVar36 = fVar33;
    iVar8 = idl1 * 2;
    iVar18 = (ip + -2) * idl1;
    for (iVar25 = 2; iVar25 != iVar1; iVar25 = iVar25 + 1) {
      fVar35 = fVar33 * fVar36 + fVar34 * -fVar32;
      fVar34 = fVar36 * fVar32 + fVar33 * fVar34;
      for (lVar16 = 0; (int)uVar22 != (int)lVar16; lVar16 = lVar16 + 1) {
        ch2[iVar7 + lVar16] = c2[iVar8 + lVar16] * fVar35 + ch2[iVar7 + lVar16];
        ch2[iVar21 + lVar16] = c2[iVar18 + lVar16] * fVar34 + ch2[iVar21 + lVar16];
      }
      iVar8 = iVar8 + idl1;
      iVar18 = iVar18 - idl1;
      fVar36 = fVar35;
    }
    iVar21 = iVar21 - idl1;
    iVar7 = iVar7 + idl1;
    fVar34 = fVar33;
  }
  iVar7 = idl1;
  for (iVar5 = 1; iVar5 < iVar1; iVar5 = iVar5 + 1) {
    for (uVar6 = 0; uVar22 != uVar6; uVar6 = uVar6 + 1) {
      ch2[uVar6] = c2[(long)iVar7 + uVar6] + ch2[uVar6];
    }
    iVar7 = iVar7 + idl1;
  }
  iVar5 = 0;
  uVar9 = 0;
  if (0 < ido) {
    uVar9 = ido;
  }
  pfVar17 = cc;
  pfVar12 = ch;
  if (ido < l1) {
    for (uVar22 = 0; pfVar11 = pfVar17, pfVar19 = pfVar12, iVar5 = iVar20, uVar22 != uVar9;
        uVar22 = uVar22 + 1) {
      while (iVar5 != 0) {
        *pfVar11 = *pfVar19;
        pfVar11 = pfVar11 + iVar4;
        pfVar19 = pfVar19 + lVar14;
        iVar5 = iVar5 + -1;
      }
      pfVar12 = pfVar12 + 1;
      pfVar17 = pfVar17 + 1;
    }
  }
  else {
    for (; iVar5 != iVar20; iVar5 = iVar5 + 1) {
      for (lVar28 = 0; uVar9 != (uint)lVar28; lVar28 = lVar28 + 1) {
        pfVar17[lVar28] = pfVar12[lVar28];
      }
      pfVar17 = pfVar17 + iVar4;
      pfVar12 = pfVar12 + lVar14;
    }
  }
  iVar7 = ido * 2;
  iVar18 = (ip + -1) * iVar3;
  iVar21 = iVar18;
  iVar25 = iVar3;
  iVar8 = iVar7;
  for (iVar5 = 1; iVar5 < iVar1; iVar5 = iVar5 + 1) {
    pfVar17 = cc + iVar8;
    pfVar12 = ch;
    iVar15 = iVar20;
    while (bVar29 = iVar15 != 0, iVar15 = iVar15 + -1, bVar29) {
      pfVar17[-1] = pfVar12[iVar25];
      *pfVar17 = pfVar12[iVar21];
      pfVar12 = pfVar12 + lVar14;
      pfVar17 = pfVar17 + iVar4;
    }
    iVar8 = iVar8 + iVar7;
    iVar25 = iVar25 + iVar3;
    iVar21 = iVar21 - iVar3;
  }
  if (ido != 1) {
    if (iVar2 < l1) {
      iVar21 = iVar7 + -2;
      iVar5 = iVar7 + 2;
      iVar25 = iVar3 + 2;
      iVar18 = iVar18 + 2;
      for (iVar2 = 1; iVar2 < iVar1; iVar2 = iVar2 + 1) {
        iVar13 = iVar5;
        iVar27 = iVar25;
        iVar15 = iVar18;
        iVar10 = iVar21;
        for (iVar8 = 2; iVar8 < ido; iVar8 = iVar8 + 2) {
          pfVar17 = cc;
          pfVar12 = ch;
          iVar24 = iVar20;
          while (bVar29 = iVar24 != 0, iVar24 = iVar24 + -1, bVar29) {
            pfVar17[(long)iVar13 + -1] = pfVar12[(long)iVar27 + -1] + pfVar12[(long)iVar15 + -1];
            pfVar17[(long)iVar10 + -1] = pfVar12[(long)iVar27 + -1] - pfVar12[(long)iVar15 + -1];
            pfVar17[iVar13] = pfVar12[iVar27] + pfVar12[iVar15];
            pfVar17[iVar10] = pfVar12[iVar15] - pfVar12[iVar27];
            pfVar12 = pfVar12 + lVar14;
            pfVar17 = pfVar17 + iVar4;
          }
          iVar10 = iVar10 + -2;
          iVar13 = iVar13 + 2;
          iVar27 = iVar27 + 2;
          iVar15 = iVar15 + 2;
        }
        iVar21 = iVar21 + iVar7;
        iVar5 = iVar5 + iVar7;
        iVar25 = iVar25 + iVar3;
        iVar18 = iVar18 - iVar3;
      }
    }
    else {
      iVar25 = iVar7 + -2;
      iVar5 = iVar3;
      iVar21 = iVar7;
      for (iVar2 = 1; iVar2 < iVar1; iVar2 = iVar2 + 1) {
        pfVar17 = cc + iVar21;
        pfVar12 = ch + iVar18;
        pfVar11 = ch + iVar5;
        iVar8 = iVar25;
        for (iVar15 = 0; lVar28 = 2, iVar10 = iVar8, iVar15 != iVar20; iVar15 = iVar15 + 1) {
          for (; lVar28 < lVar14; lVar28 = lVar28 + 2) {
            pfVar17[lVar28 + -1] = pfVar11[lVar28 + -1] + pfVar12[lVar28 + -1];
            cc[(long)iVar10 + -1] = pfVar11[lVar28 + -1] - pfVar12[lVar28 + -1];
            pfVar17[lVar28] = pfVar11[lVar28] + pfVar12[lVar28];
            cc[iVar10] = pfVar12[lVar28] - pfVar11[lVar28];
            iVar10 = iVar10 + -2;
          }
          pfVar17 = pfVar17 + iVar4;
          pfVar12 = pfVar12 + lVar14;
          pfVar11 = pfVar11 + lVar14;
          iVar8 = iVar8 + iVar4;
        }
        iVar21 = iVar21 + iVar7;
        iVar5 = iVar5 + iVar3;
        iVar18 = iVar18 - iVar3;
        iVar25 = iVar25 + iVar7;
      }
    }
  }
  return;
}

Assistant:

static void dradfg(int ido,int ip,int l1,int idl1,float *cc,float *c1,
                          float *c2,float *ch,float *ch2,float *wa){

  static float tpi=6.283185307179586f;
  int idij,ipph,i,j,k,l,ic,ik,is;
  int t0,t1,t2,t3,t4,t5,t6,t7,t8,t9,t10;
  float dc2,ai1,ai2,ar1,ar2,ds2;
  int nbd;
  float dcp,arg,dsp,ar1h,ar2h;
  int idp2,ipp2;

  arg=tpi/(float)ip;
  dcp=cos(arg);
  dsp=sin(arg);
  ipph=(ip+1)>>1;
  ipp2=ip;
  idp2=ido;
  nbd=(ido-1)>>1;
  t0=l1*ido;
  t10=ip*ido;

  if(ido==1)goto L119;
  for(ik=0;ik<idl1;ik++)ch2[ik]=c2[ik];

  t1=0;
  for(j=1;j<ip;j++){
    t1+=t0;
    t2=t1;
    for(k=0;k<l1;k++){
      ch[t2]=c1[t2];
      t2+=ido;
    }
  }

  is=-ido;
  t1=0;
  if(nbd>l1){
    for(j=1;j<ip;j++){
      t1+=t0;
      is+=ido;
      t2= -ido+t1;
      for(k=0;k<l1;k++){
        idij=is-1;
        t2+=ido;
        t3=t2;
        for(i=2;i<ido;i+=2){
          idij+=2;
          t3+=2;
          ch[t3-1]=wa[idij-1]*c1[t3-1]+wa[idij]*c1[t3];
          ch[t3]=wa[idij-1]*c1[t3]-wa[idij]*c1[t3-1];
        }
      }
    }
  }else{

    for(j=1;j<ip;j++){
      is+=ido;
      idij=is-1;
      t1+=t0;
      t2=t1;
      for(i=2;i<ido;i+=2){
        idij+=2;
        t2+=2;
        t3=t2;
        for(k=0;k<l1;k++){
          ch[t3-1]=wa[idij-1]*c1[t3-1]+wa[idij]*c1[t3];
          ch[t3]=wa[idij-1]*c1[t3]-wa[idij]*c1[t3-1];
          t3+=ido;
        }
      }
    }
  }

  t1=0;
  t2=ipp2*t0;
  if(nbd<l1){
    for(j=1;j<ipph;j++){
      t1+=t0;
      t2-=t0;
      t3=t1;
      t4=t2;
      for(i=2;i<ido;i+=2){
        t3+=2;
        t4+=2;
        t5=t3-ido;
        t6=t4-ido;
        for(k=0;k<l1;k++){
          t5+=ido;
          t6+=ido;
          c1[t5-1]=ch[t5-1]+ch[t6-1];
          c1[t6-1]=ch[t5]-ch[t6];
          c1[t5]=ch[t5]+ch[t6];
          c1[t6]=ch[t6-1]-ch[t5-1];
        }
      }
    }
  }else{
    for(j=1;j<ipph;j++){
      t1+=t0;
      t2-=t0;
      t3=t1;
      t4=t2;
      for(k=0;k<l1;k++){
        t5=t3;
        t6=t4;
        for(i=2;i<ido;i+=2){
          t5+=2;
          t6+=2;
          c1[t5-1]=ch[t5-1]+ch[t6-1];
          c1[t6-1]=ch[t5]-ch[t6];
          c1[t5]=ch[t5]+ch[t6];
          c1[t6]=ch[t6-1]-ch[t5-1];
        }
        t3+=ido;
        t4+=ido;
      }
    }
  }

L119:
  for(ik=0;ik<idl1;ik++)c2[ik]=ch2[ik];

  t1=0;
  t2=ipp2*idl1;
  for(j=1;j<ipph;j++){
    t1+=t0;
    t2-=t0;
    t3=t1-ido;
    t4=t2-ido;
    for(k=0;k<l1;k++){
      t3+=ido;
      t4+=ido;
      c1[t3]=ch[t3]+ch[t4];
      c1[t4]=ch[t4]-ch[t3];
    }
  }

  ar1=1.f;
  ai1=0.f;
  t1=0;
  t2=ipp2*idl1;
  t3=(ip-1)*idl1;
  for(l=1;l<ipph;l++){
    t1+=idl1;
    t2-=idl1;
    ar1h=dcp*ar1-dsp*ai1;
    ai1=dcp*ai1+dsp*ar1;
    ar1=ar1h;
    t4=t1;
    t5=t2;
    t6=t3;
    t7=idl1;

    for(ik=0;ik<idl1;ik++){
      ch2[t4++]=c2[ik]+ar1*c2[t7++];
      ch2[t5++]=ai1*c2[t6++];
    }

    dc2=ar1;
    ds2=ai1;
    ar2=ar1;
    ai2=ai1;

    t4=idl1;
    t5=(ipp2-1)*idl1;
    for(j=2;j<ipph;j++){
      t4+=idl1;
      t5-=idl1;

      ar2h=dc2*ar2-ds2*ai2;
      ai2=dc2*ai2+ds2*ar2;
      ar2=ar2h;

      t6=t1;
      t7=t2;
      t8=t4;
      t9=t5;
      for(ik=0;ik<idl1;ik++){
        ch2[t6++]+=ar2*c2[t8++];
        ch2[t7++]+=ai2*c2[t9++];
      }
    }
  }

  t1=0;
  for(j=1;j<ipph;j++){
    t1+=idl1;
    t2=t1;
    for(ik=0;ik<idl1;ik++)ch2[ik]+=c2[t2++];
  }

  if(ido<l1)goto L132;

  t1=0;
  t2=0;
  for(k=0;k<l1;k++){
    t3=t1;
    t4=t2;
    for(i=0;i<ido;i++)cc[t4++]=ch[t3++];
    t1+=ido;
    t2+=t10;
  }

  goto L135;

 L132:
  for(i=0;i<ido;i++){
    t1=i;
    t2=i;
    for(k=0;k<l1;k++){
      cc[t2]=ch[t1];
      t1+=ido;
      t2+=t10;
    }
  }

 L135:
  t1=0;
  t2=ido<<1;
  t3=0;
  t4=ipp2*t0;
  for(j=1;j<ipph;j++){

    t1+=t2;
    t3+=t0;
    t4-=t0;

    t5=t1;
    t6=t3;
    t7=t4;

    for(k=0;k<l1;k++){
      cc[t5-1]=ch[t6];
      cc[t5]=ch[t7];
      t5+=t10;
      t6+=ido;
      t7+=ido;
    }
  }

  if(ido==1)return;
  if(nbd<l1)goto L141;

  t1=-ido;
  t3=0;
  t4=0;
  t5=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t2;
    t3+=t2;
    t4+=t0;
    t5-=t0;
    t6=t1;
    t7=t3;
    t8=t4;
    t9=t5;
    for(k=0;k<l1;k++){
      for(i=2;i<ido;i+=2){
        ic=idp2-i;
        cc[i+t7-1]=ch[i+t8-1]+ch[i+t9-1];
        cc[ic+t6-1]=ch[i+t8-1]-ch[i+t9-1];
        cc[i+t7]=ch[i+t8]+ch[i+t9];
        cc[ic+t6]=ch[i+t9]-ch[i+t8];
      }
      t6+=t10;
      t7+=t10;
      t8+=ido;
      t9+=ido;
    }
  }
  return;

 L141:

  t1=-ido;
  t3=0;
  t4=0;
  t5=ipp2*t0;
  for(j=1;j<ipph;j++){
    t1+=t2;
    t3+=t2;
    t4+=t0;
    t5-=t0;
    for(i=2;i<ido;i+=2){
      t6=idp2+t1-i;
      t7=i+t3;
      t8=i+t4;
      t9=i+t5;
      for(k=0;k<l1;k++){
        cc[t7-1]=ch[t8-1]+ch[t9-1];
        cc[t6-1]=ch[t8-1]-ch[t9-1];
        cc[t7]=ch[t8]+ch[t9];
        cc[t6]=ch[t9]-ch[t8];
        t6+=t10;
        t7+=t10;
        t8+=ido;
        t9+=ido;
      }
    }
  }
}